

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jfdctint.c
# Opt level: O0

void jpeg_fdct_12x6(DCTELEM *data,JSAMPARRAY sample_data,JDIMENSION start_col)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  int iVar5;
  byte *pbVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  uint in_EDX;
  long in_RSI;
  int *in_RDI;
  int ctr;
  JSAMPROW elemptr;
  DCTELEM *dataptr;
  INT32 tmp15;
  INT32 tmp14;
  INT32 tmp13;
  INT32 tmp12;
  INT32 tmp11;
  INT32 tmp10;
  INT32 tmp5;
  INT32 tmp4;
  INT32 tmp3;
  INT32 tmp2;
  INT32 tmp1;
  INT32 tmp0;
  int local_8c;
  int *local_80;
  
  memset(in_RDI + 0x30,0,0x40);
  local_80 = in_RDI;
  for (local_8c = 0; local_8c < 6; local_8c = local_8c + 1) {
    pbVar6 = (byte *)(*(long *)(in_RSI + (long)local_8c * 8) + (ulong)in_EDX);
    lVar7 = (long)(int)((uint)*pbVar6 + (uint)pbVar6[0xb]) +
            (long)(int)((uint)pbVar6[5] + (uint)pbVar6[6]);
    lVar8 = (long)(int)((uint)*pbVar6 + (uint)pbVar6[0xb]) -
            (long)(int)((uint)pbVar6[5] + (uint)pbVar6[6]);
    lVar9 = (long)(int)((uint)pbVar6[1] + (uint)pbVar6[10]) -
            (long)(int)((uint)pbVar6[4] + (uint)pbVar6[7]);
    lVar10 = (long)(int)((uint)pbVar6[2] + (uint)pbVar6[9]) +
             (long)(int)((uint)pbVar6[3] + (uint)pbVar6[8]);
    lVar11 = (long)(int)((uint)pbVar6[2] + (uint)pbVar6[9]) -
             (long)(int)((uint)pbVar6[3] + (uint)pbVar6[8]);
    lVar12 = (long)(int)((uint)*pbVar6 - (uint)pbVar6[0xb]);
    bVar1 = pbVar6[1];
    bVar2 = pbVar6[10];
    lVar13 = (long)(int)((uint)pbVar6[2] - (uint)pbVar6[9]);
    lVar14 = (long)(int)((uint)pbVar6[3] - (uint)pbVar6[8]);
    bVar3 = pbVar6[4];
    bVar4 = pbVar6[7];
    lVar15 = (long)(int)((uint)pbVar6[5] - (uint)pbVar6[6]);
    *local_80 = ((int)lVar7 + (uint)pbVar6[1] + (uint)pbVar6[10] + (uint)pbVar6[4] + (uint)pbVar6[7]
                 + (int)lVar10 + -0x600) * 4;
    local_80[6] = (((int)lVar8 - (int)lVar9) - (int)lVar11) * 4;
    local_80[4] = (int)((lVar7 - lVar10) * 0x2731 + 0x400 >> 0xb);
    local_80[2] = (int)((lVar9 - lVar11) + (lVar8 + lVar11) * 0x2bb6 + 0x400 >> 0xb);
    lVar8 = ((long)(int)((uint)bVar1 - (uint)bVar2) + (long)(int)((uint)bVar3 - (uint)bVar4)) *
            0x1151;
    lVar7 = lVar8 + (long)(int)((uint)bVar1 - (uint)bVar2) * 0x187e;
    lVar8 = lVar8 + (long)(int)((uint)bVar3 - (uint)bVar4) * -0x3b21;
    lVar9 = (lVar12 + lVar13) * 0x23e7;
    lVar10 = (lVar12 + lVar14) * 0x1b8d;
    lVar11 = (lVar13 + lVar14) * -0x5e8;
    local_80[1] = (int)(lVar9 + lVar10 + lVar7 + lVar12 * -0x1296 + lVar15 * 0x5e8 + 0x400 >> 0xb);
    local_80[3] = (int)(lVar8 + (lVar12 - lVar14) * 0x29cf + (lVar13 + lVar15) * -0x1151 + 0x400 >>
                       0xb);
    local_80[5] = (int)((lVar11 - lVar8) + lVar13 * -0x4add + lVar15 * 0x1b8d + lVar9 + 0x400 >> 0xb
                       );
    local_80[7] = (int)((lVar11 - lVar7) + lVar14 * 0x173a + lVar15 * -0x23e7 + lVar10 + 0x400 >>
                       0xb);
    local_80 = local_80 + 8;
  }
  local_80 = in_RDI;
  for (local_8c = 7; -1 < local_8c; local_8c = local_8c + -1) {
    iVar5 = *local_80;
    lVar7 = (long)(local_80[8] + local_80[0x20]);
    lVar8 = (long)(iVar5 + local_80[0x28]) + (long)(local_80[0x10] + local_80[0x18]);
    lVar9 = (long)(*local_80 - local_80[0x28]);
    lVar10 = (long)(local_80[8] - local_80[0x20]);
    lVar11 = (long)(local_80[0x10] - local_80[0x18]);
    *local_80 = (int)((ulong)((lVar8 + lVar7) * 0x38e4 + 0x8000) >> 0x10);
    local_80[0x10] =
         (int)((ulong)(((long)(iVar5 + local_80[0x28]) - (long)(local_80[0x10] + local_80[0x18])) *
                       0x45ad + 0x8000) >> 0x10);
    local_80[0x20] = (int)((ulong)(((lVar8 - lVar7) - lVar7) * 0x283a + 0x8000) >> 0x10);
    lVar7 = (lVar9 + lVar11) * 0x14d3;
    local_80[8] = (int)((ulong)(lVar7 + (lVar9 + lVar10) * 0x38e4 + 0x8000) >> 0x10);
    local_80[0x18] = (int)((ulong)(((lVar9 - lVar10) - lVar11) * 0x38e4 + 0x8000) >> 0x10);
    local_80[0x28] = (int)((ulong)(lVar7 + (lVar11 - lVar10) * 0x38e4 + 0x8000) >> 0x10);
    local_80 = local_80 + 1;
  }
  return;
}

Assistant:

GLOBAL(void)
jpeg_fdct_12x6 (DCTELEM * data, JSAMPARRAY sample_data, JDIMENSION start_col)
{
  INT32 tmp0, tmp1, tmp2, tmp3, tmp4, tmp5;
  INT32 tmp10, tmp11, tmp12, tmp13, tmp14, tmp15;
  DCTELEM *dataptr;
  JSAMPROW elemptr;
  int ctr;
  SHIFT_TEMPS

  /* Zero 2 bottom rows of output coefficient block. */
  MEMZERO(&data[DCTSIZE*6], SIZEOF(DCTELEM) * DCTSIZE * 2);

  /* Pass 1: process rows. */
  /* Note results are scaled up by sqrt(8) compared to a true DCT; */
  /* furthermore, we scale the results by 2**PASS1_BITS. */
  /* 12-point FDCT kernel, cK represents sqrt(2) * cos(K*pi/24). */

  dataptr = data;
  for (ctr = 0; ctr < 6; ctr++) {
    elemptr = sample_data[ctr] + start_col;

    /* Even part */

    tmp0 = GETJSAMPLE(elemptr[0]) + GETJSAMPLE(elemptr[11]);
    tmp1 = GETJSAMPLE(elemptr[1]) + GETJSAMPLE(elemptr[10]);
    tmp2 = GETJSAMPLE(elemptr[2]) + GETJSAMPLE(elemptr[9]);
    tmp3 = GETJSAMPLE(elemptr[3]) + GETJSAMPLE(elemptr[8]);
    tmp4 = GETJSAMPLE(elemptr[4]) + GETJSAMPLE(elemptr[7]);
    tmp5 = GETJSAMPLE(elemptr[5]) + GETJSAMPLE(elemptr[6]);

    tmp10 = tmp0 + tmp5;
    tmp13 = tmp0 - tmp5;
    tmp11 = tmp1 + tmp4;
    tmp14 = tmp1 - tmp4;
    tmp12 = tmp2 + tmp3;
    tmp15 = tmp2 - tmp3;

    tmp0 = GETJSAMPLE(elemptr[0]) - GETJSAMPLE(elemptr[11]);
    tmp1 = GETJSAMPLE(elemptr[1]) - GETJSAMPLE(elemptr[10]);
    tmp2 = GETJSAMPLE(elemptr[2]) - GETJSAMPLE(elemptr[9]);
    tmp3 = GETJSAMPLE(elemptr[3]) - GETJSAMPLE(elemptr[8]);
    tmp4 = GETJSAMPLE(elemptr[4]) - GETJSAMPLE(elemptr[7]);
    tmp5 = GETJSAMPLE(elemptr[5]) - GETJSAMPLE(elemptr[6]);

    /* Apply unsigned->signed conversion */
    dataptr[0] = (DCTELEM)
      ((tmp10 + tmp11 + tmp12 - 12 * CENTERJSAMPLE) << PASS1_BITS);
    dataptr[6] = (DCTELEM) ((tmp13 - tmp14 - tmp15) << PASS1_BITS);
    dataptr[4] = (DCTELEM)
      DESCALE(MULTIPLY(tmp10 - tmp12, FIX(1.224744871)), /* c4 */
	      CONST_BITS-PASS1_BITS);
    dataptr[2] = (DCTELEM)
      DESCALE(tmp14 - tmp15 + MULTIPLY(tmp13 + tmp15, FIX(1.366025404)), /* c2 */
	      CONST_BITS-PASS1_BITS);

    /* Odd part */

    tmp10 = MULTIPLY(tmp1 + tmp4, FIX_0_541196100);    /* c9 */
    tmp14 = tmp10 + MULTIPLY(tmp1, FIX_0_765366865);   /* c3-c9 */
    tmp15 = tmp10 - MULTIPLY(tmp4, FIX_1_847759065);   /* c3+c9 */
    tmp12 = MULTIPLY(tmp0 + tmp2, FIX(1.121971054));   /* c5 */
    tmp13 = MULTIPLY(tmp0 + tmp3, FIX(0.860918669));   /* c7 */
    tmp10 = tmp12 + tmp13 + tmp14 - MULTIPLY(tmp0, FIX(0.580774953)) /* c5+c7-c1 */
	    + MULTIPLY(tmp5, FIX(0.184591911));        /* c11 */
    tmp11 = MULTIPLY(tmp2 + tmp3, - FIX(0.184591911)); /* -c11 */
    tmp12 += tmp11 - tmp15 - MULTIPLY(tmp2, FIX(2.339493912)) /* c1+c5-c11 */
	    + MULTIPLY(tmp5, FIX(0.860918669));        /* c7 */
    tmp13 += tmp11 - tmp14 + MULTIPLY(tmp3, FIX(0.725788011)) /* c1+c11-c7 */
	    - MULTIPLY(tmp5, FIX(1.121971054));        /* c5 */
    tmp11 = tmp15 + MULTIPLY(tmp0 - tmp3, FIX(1.306562965)) /* c3 */
	    - MULTIPLY(tmp2 + tmp5, FIX_0_541196100);  /* c9 */

    dataptr[1] = (DCTELEM) DESCALE(tmp10, CONST_BITS-PASS1_BITS);
    dataptr[3] = (DCTELEM) DESCALE(tmp11, CONST_BITS-PASS1_BITS);
    dataptr[5] = (DCTELEM) DESCALE(tmp12, CONST_BITS-PASS1_BITS);
    dataptr[7] = (DCTELEM) DESCALE(tmp13, CONST_BITS-PASS1_BITS);

    dataptr += DCTSIZE;		/* advance pointer to next row */
  }

  /* Pass 2: process columns.
   * We remove the PASS1_BITS scaling, but leave the results scaled up
   * by an overall factor of 8.
   * We must also scale the output by (8/12)*(8/6) = 8/9, which we
   * partially fold into the constant multipliers and final shifting:
   * 6-point FDCT kernel, cK represents sqrt(2) * cos(K*pi/12) * 16/9.
   */

  dataptr = data;
  for (ctr = DCTSIZE-1; ctr >= 0; ctr--) {
    /* Even part */

    tmp0 = dataptr[DCTSIZE*0] + dataptr[DCTSIZE*5];
    tmp11 = dataptr[DCTSIZE*1] + dataptr[DCTSIZE*4];
    tmp2 = dataptr[DCTSIZE*2] + dataptr[DCTSIZE*3];

    tmp10 = tmp0 + tmp2;
    tmp12 = tmp0 - tmp2;

    tmp0 = dataptr[DCTSIZE*0] - dataptr[DCTSIZE*5];
    tmp1 = dataptr[DCTSIZE*1] - dataptr[DCTSIZE*4];
    tmp2 = dataptr[DCTSIZE*2] - dataptr[DCTSIZE*3];

    dataptr[DCTSIZE*0] = (DCTELEM)
      DESCALE(MULTIPLY(tmp10 + tmp11, FIX(1.777777778)),         /* 16/9 */
	      CONST_BITS+PASS1_BITS+1);
    dataptr[DCTSIZE*2] = (DCTELEM)
      DESCALE(MULTIPLY(tmp12, FIX(2.177324216)),                 /* c2 */
	      CONST_BITS+PASS1_BITS+1);
    dataptr[DCTSIZE*4] = (DCTELEM)
      DESCALE(MULTIPLY(tmp10 - tmp11 - tmp11, FIX(1.257078722)), /* c4 */
	      CONST_BITS+PASS1_BITS+1);

    /* Odd part */

    tmp10 = MULTIPLY(tmp0 + tmp2, FIX(0.650711829));             /* c5 */

    dataptr[DCTSIZE*1] = (DCTELEM)
      DESCALE(tmp10 + MULTIPLY(tmp0 + tmp1, FIX(1.777777778)),   /* 16/9 */
	      CONST_BITS+PASS1_BITS+1);
    dataptr[DCTSIZE*3] = (DCTELEM)
      DESCALE(MULTIPLY(tmp0 - tmp1 - tmp2, FIX(1.777777778)),    /* 16/9 */
	      CONST_BITS+PASS1_BITS+1);
    dataptr[DCTSIZE*5] = (DCTELEM)
      DESCALE(tmp10 + MULTIPLY(tmp2 - tmp1, FIX(1.777777778)),   /* 16/9 */
	      CONST_BITS+PASS1_BITS+1);

    dataptr++;			/* advance pointer to next column */
  }
}